

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-common.c
# Opt level: O0

void swap_linux_usb_header(pcap_pkthdr *hdr,u_char *buf,int header_len_64_bytes)

{
  uint local_3c;
  uint *puStack_38;
  u_int32_t i;
  usb_isodesc *pisodesc;
  bpf_u_int32 offset;
  pcap_usb_header_mmapped *uhdr;
  int header_len_64_bytes_local;
  u_char *buf_local;
  pcap_pkthdr *hdr_local;
  
  if ((((7 < hdr->caplen) &&
       (*(ulong *)buf =
             *(ulong *)buf >> 0x38 | (*(ulong *)buf & 0xff000000000000) >> 0x28 |
             (*(ulong *)buf & 0xff0000000000) >> 0x18 | (*(ulong *)buf & 0xff00000000) >> 8 |
             (*(ulong *)buf & 0xff000000) << 8 | (*(ulong *)buf & 0xff0000) << 0x18 |
             (*(ulong *)buf & 0xff00) << 0x28 | *(long *)buf << 0x38, 0xd < hdr->caplen)) &&
      (*(ushort *)(buf + 0xc) = *(short *)(buf + 0xc) << 8 | *(ushort *)(buf + 0xc) >> 8,
      0x17 < hdr->caplen)) &&
     (((*(ulong *)(buf + 0x10) =
             *(ulong *)(buf + 0x10) >> 0x38 |
             (long)(*(ulong *)(buf + 0x10) & 0xff000000000000) >> 0x28 |
             (long)(*(ulong *)(buf + 0x10) & 0xff0000000000) >> 0x18 |
             (long)(*(ulong *)(buf + 0x10) & 0xff00000000) >> 8 |
             (*(ulong *)(buf + 0x10) & 0xff000000) << 8 |
             (*(ulong *)(buf + 0x10) & 0xff0000) << 0x18 | (*(ulong *)(buf + 0x10) & 0xff00) << 0x28
             | *(long *)(buf + 0x10) << 0x38, 0x1b < hdr->caplen &&
       (*(uint *)(buf + 0x18) =
             *(int *)(buf + 0x18) << 0x18 | (*(uint *)(buf + 0x18) & 0xff00) << 8 |
             (int)(*(uint *)(buf + 0x18) & 0xff0000) >> 8 | *(int *)(buf + 0x18) >> 0x18 & 0xffU,
       0x1f < hdr->caplen)) &&
      ((*(uint *)(buf + 0x1c) =
             *(int *)(buf + 0x1c) << 0x18 | (*(uint *)(buf + 0x1c) & 0xff00) << 8 |
             (int)(*(uint *)(buf + 0x1c) & 0xff0000) >> 8 | *(int *)(buf + 0x1c) >> 0x18 & 0xffU,
       0x23 < hdr->caplen &&
       (*(uint *)(buf + 0x20) =
             *(int *)(buf + 0x20) << 0x18 | (*(uint *)(buf + 0x20) & 0xff00) << 8 |
             (*(uint *)(buf + 0x20) & 0xff0000) >> 8 | *(uint *)(buf + 0x20) >> 0x18,
       0x27 < hdr->caplen)))))) {
    *(uint *)(buf + 0x24) =
         *(int *)(buf + 0x24) << 0x18 | (*(uint *)(buf + 0x24) & 0xff00) << 8 |
         (*(uint *)(buf + 0x24) & 0xff0000) >> 8 | *(uint *)(buf + 0x24) >> 0x18;
    if (buf[9] == '\0') {
      if (hdr->caplen < 0x2c) {
        return;
      }
      *(uint *)(buf + 0x28) =
           *(int *)(buf + 0x28) << 0x18 | (*(uint *)(buf + 0x28) & 0xff00) << 8 |
           (int)(*(uint *)(buf + 0x28) & 0xff0000) >> 8 | *(int *)(buf + 0x28) >> 0x18 & 0xffU;
      if (hdr->caplen < 0x30) {
        return;
      }
      *(uint *)(buf + 0x2c) =
           *(int *)(buf + 0x2c) << 0x18 | (*(uint *)(buf + 0x2c) & 0xff00) << 8 |
           (int)(*(uint *)(buf + 0x2c) & 0xff0000) >> 8 | *(int *)(buf + 0x2c) >> 0x18 & 0xffU;
    }
    if (((header_len_64_bytes != 0) && (0x33 < hdr->caplen)) &&
       ((*(uint *)(buf + 0x30) =
              *(int *)(buf + 0x30) << 0x18 | (*(uint *)(buf + 0x30) & 0xff00) << 8 |
              (int)(*(uint *)(buf + 0x30) & 0xff0000) >> 8 | *(int *)(buf + 0x30) >> 0x18 & 0xffU,
        0x37 < hdr->caplen &&
        (*(uint *)(buf + 0x34) =
              *(int *)(buf + 0x34) << 0x18 | (*(uint *)(buf + 0x34) & 0xff00) << 8 |
              (int)(*(uint *)(buf + 0x34) & 0xff0000) >> 8 | *(int *)(buf + 0x34) >> 0x18 & 0xffU,
        0x3b < hdr->caplen)))) {
      *(uint *)(buf + 0x38) =
           *(int *)(buf + 0x38) << 0x18 | (*(uint *)(buf + 0x38) & 0xff00) << 8 |
           (*(uint *)(buf + 0x38) & 0xff0000) >> 8 | *(uint *)(buf + 0x38) >> 0x18;
      pisodesc._4_4_ = 0x40;
      if ((0x3f < hdr->caplen) &&
         (*(uint *)(buf + 0x3c) =
               *(int *)(buf + 0x3c) << 0x18 | (*(uint *)(buf + 0x3c) & 0xff00) << 8 |
               (*(uint *)(buf + 0x3c) & 0xff0000) >> 8 | *(uint *)(buf + 0x3c) >> 0x18,
         buf[9] == '\0')) {
        puStack_38 = (uint *)(buf + 0x40);
        local_3c = 0;
        for (; (((local_3c < *(uint *)(buf + 0x3c) && (pisodesc._4_4_ + 4U <= hdr->caplen)) &&
                (*puStack_38 = *puStack_38 << 0x18 | (*puStack_38 & 0xff00) << 8 |
                               (int)(*puStack_38 & 0xff0000) >> 8 | (int)*puStack_38 >> 0x18 & 0xffU
                , pisodesc._4_4_ + 8U <= hdr->caplen)) &&
               (puStack_38[1] =
                     puStack_38[1] << 0x18 | (puStack_38[1] & 0xff00) << 8 |
                     (puStack_38[1] & 0xff0000) >> 8 | puStack_38[1] >> 0x18,
               pisodesc._4_4_ + 0xcU <= hdr->caplen)); pisodesc._4_4_ = pisodesc._4_4_ + 0x10) {
          puStack_38[2] =
               puStack_38[2] << 0x18 | (puStack_38[2] & 0xff00) << 8 |
               (puStack_38[2] & 0xff0000) >> 8 | puStack_38[2] >> 0x18;
          puStack_38 = puStack_38 + 4;
          local_3c = local_3c + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
swap_linux_usb_header(const struct pcap_pkthdr *hdr, u_char *buf,
    int header_len_64_bytes)
{
	pcap_usb_header_mmapped *uhdr = (pcap_usb_header_mmapped *)buf;
	bpf_u_int32 offset = 0;

	/*
	 * "offset" is the offset *past* the field we're swapping;
	 * we skip the field *before* checking to make sure
	 * the captured data length includes the entire field.
	 */

	/*
	 * The URB id is a totally opaque value; do we really need to
	 * convert it to the reading host's byte order???
	 */
	offset += 8;			/* skip past id */
	if (hdr->caplen < offset)
		return;
	uhdr->id = SWAPLL(uhdr->id);

	offset += 4;			/* skip past various 1-byte fields */

	offset += 2;			/* skip past bus_id */
	if (hdr->caplen < offset)
		return;
	uhdr->bus_id = SWAPSHORT(uhdr->bus_id);

	offset += 2;			/* skip past various 1-byte fields */

	offset += 8;			/* skip past ts_sec */
	if (hdr->caplen < offset)
		return;
	uhdr->ts_sec = SWAPLL(uhdr->ts_sec);

	offset += 4;			/* skip past ts_usec */
	if (hdr->caplen < offset)
		return;
	uhdr->ts_usec = SWAPLONG(uhdr->ts_usec);

	offset += 4;			/* skip past status */
	if (hdr->caplen < offset)
		return;
	uhdr->status = SWAPLONG(uhdr->status);

	offset += 4;			/* skip past urb_len */
	if (hdr->caplen < offset)
		return;
	uhdr->urb_len = SWAPLONG(uhdr->urb_len);

	offset += 4;			/* skip past data_len */
	if (hdr->caplen < offset)
		return;
	uhdr->data_len = SWAPLONG(uhdr->data_len);

	if (uhdr->transfer_type == URB_ISOCHRONOUS) {
		offset += 4;			/* skip past s.iso.error_count */
		if (hdr->caplen < offset)
			return;
		uhdr->s.iso.error_count = SWAPLONG(uhdr->s.iso.error_count);

		offset += 4;			/* skip past s.iso.numdesc */
		if (hdr->caplen < offset)
			return;
		uhdr->s.iso.numdesc = SWAPLONG(uhdr->s.iso.numdesc);
	} else
		offset += 8;			/* skip USB setup header */

	/*
	 * With the old header, there are no isochronous descriptors
	 * after the header.
	 *
	 * With the new header, the actual number of descriptors in
	 * the header is not s.iso.numdesc, it's ndesc - only the
	 * first N descriptors, for some value of N, are put into
	 * the header, and ndesc is set to the actual number copied.
	 * In addition, if s.iso.numdesc is negative, no descriptors
	 * are captured, and ndesc is set to 0.
	 */
	if (header_len_64_bytes) {
		/*
		 * This is either the "version 1" header, with
		 * 16 bytes of additional fields at the end, or
		 * a "version 0" header from a memory-mapped
		 * capture, with 16 bytes of zeroed-out padding
		 * at the end.  Byte swap them as if this were
		 * a "version 1" header.
		 */
		offset += 4;			/* skip past interval */
		if (hdr->caplen < offset)
			return;
		uhdr->interval = SWAPLONG(uhdr->interval);

		offset += 4;			/* skip past start_frame */
		if (hdr->caplen < offset)
			return;
		uhdr->start_frame = SWAPLONG(uhdr->start_frame);

		offset += 4;			/* skip past xfer_flags */
		if (hdr->caplen < offset)
			return;
		uhdr->xfer_flags = SWAPLONG(uhdr->xfer_flags);

		offset += 4;			/* skip past ndesc */
		if (hdr->caplen < offset)
			return;
		uhdr->ndesc = SWAPLONG(uhdr->ndesc);

		if (uhdr->transfer_type == URB_ISOCHRONOUS) {
			/* swap the values in struct linux_usb_isodesc */
			usb_isodesc *pisodesc;
			u_int32_t i;

			pisodesc = (usb_isodesc *)(void *)(buf+offset);
			for (i = 0; i < uhdr->ndesc; i++) {
				offset += 4;		/* skip past status */
				if (hdr->caplen < offset)
					return;
				pisodesc->status = SWAPLONG(pisodesc->status);

				offset += 4;		/* skip past offset */
				if (hdr->caplen < offset)
					return;
				pisodesc->offset = SWAPLONG(pisodesc->offset);

				offset += 4;		/* skip past len */
				if (hdr->caplen < offset)
					return;
				pisodesc->len = SWAPLONG(pisodesc->len);

				offset += 4;		/* skip past padding */

				pisodesc++;
			}
		}
	}
}